

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwizard.cpp
# Opt level: O1

void __thiscall QWizardPage::setTitle(QWizardPage *this,QString *title)

{
  long lVar1;
  long lVar2;
  QWizardPage *pQVar3;
  long in_FS_OFFSET;
  QWizardPage *local_28;
  int local_1c;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)&(this->super_QWidget).field_0x8;
  QString::operator=((QString *)(lVar1 + 0x260),(QString *)title);
  if (*(long *)(lVar1 + 600) != 0) {
    lVar2 = *(long *)(*(long *)(lVar1 + 600) + 8);
    local_1c = *(int *)(lVar2 + 0x340);
    local_28 = (QWizardPage *)0x0;
    pQVar3 = QMap<int,_QWizardPage_*>::value
                       ((QMap<int,_QWizardPage_*> *)(lVar2 + 0x2e0),&local_1c,&local_28);
    if (pQVar3 == this) {
      QWizardPrivate::updateLayout(*(QWizardPrivate **)(*(long *)(lVar1 + 600) + 8));
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWizardPage::setTitle(const QString &title)
{
    Q_D(QWizardPage);
    d->title = title;
    if (d->wizard && d->wizard->currentPage() == this)
        d->wizard->d_func()->updateLayout();
}